

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O3

void vrna_aln_encode(char *sequence,short **S_p,short **s5_p,short **s3_p,char **ss_p,uint **as_p,
                    vrna_md_t *md)

{
  long lVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  size_t sVar5;
  short *psVar6;
  uint *puVar7;
  char *pcVar8;
  short *psVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  short *psVar14;
  
  sVar5 = strlen(sequence);
  uVar4 = (uint)sVar5;
  uVar12 = uVar4 * 2 + 4;
  psVar6 = (short *)vrna_alloc(uVar12);
  *s5_p = psVar6;
  psVar6 = (short *)vrna_alloc(uVar12);
  *s3_p = psVar6;
  puVar7 = (uint *)vrna_alloc(uVar4 * 4 + 8);
  *as_p = puVar7;
  pcVar8 = (char *)vrna_alloc(uVar4 + 2);
  *ss_p = pcVar8;
  psVar6 = vrna_seq_encode_simple(sequence,md);
  *S_p = psVar6;
  psVar9 = *s5_p;
  psVar9[0] = 0;
  psVar9[1] = 0;
  if (md->oldAliEn != 0) {
    **ss_p = *sequence;
    if (1 < uVar4) {
      lVar13 = 0;
      do {
        psVar6 = *S_p;
        (*s5_p)[lVar13 + 1] = psVar6[lVar13];
        (*s3_p)[lVar13 + 1] = psVar6[lVar13 + 2];
        (*ss_p)[lVar13 + 1] = sequence[lVar13 + 1];
        lVar1 = lVar13 + 1;
        (*as_p)[lVar13 + 1] = (uint)lVar1;
        lVar13 = lVar1;
      } while ((sVar5 & 0xffffffff) - 1 != lVar1);
    }
    uVar11 = sVar5 & 0xffffffff;
    (*ss_p)[uVar11] = sequence[uVar11];
    (*as_p)[uVar11] = uVar4;
    psVar6 = *S_p;
    psVar9 = *s5_p;
    psVar9[uVar11] = psVar6[uVar4 - 1];
    psVar14 = *s3_p;
    psVar14[uVar11] = 0;
    psVar6[uVar4 + 1] = psVar6[1];
    psVar9[1] = 0;
    if (md->circ == 0) {
      return;
    }
    psVar9[1] = psVar6[uVar11];
    sVar3 = psVar6[1];
    psVar14[uVar11] = sVar3;
    (*ss_p)[uVar4 + 1] = (char)sVar3;
    return;
  }
  if (md->circ == 0) {
    (*s3_p)[sVar5 & 0xffffffff] = 0;
    psVar9[1] = 0;
  }
  else {
    if (uVar4 == 0) {
      return;
    }
    uVar11 = sVar5 & 0xffffffff;
    do {
      bVar2 = sequence[uVar11 - 1];
      if (((1 < bVar2 - 0x2d) && (bVar2 != 0x5f)) && (bVar2 != 0x7e)) {
        psVar9[1] = psVar6[uVar11 & 0xffffffff];
        break;
      }
      uVar11 = uVar11 - 1;
    } while (uVar11 != 0);
    if (uVar4 == 0) {
      return;
    }
    uVar12 = 1;
    do {
      bVar2 = sequence[uVar12 - 1];
      if (((1 < bVar2 - 0x2d) && (bVar2 != 0x5f)) && (bVar2 != 0x7e)) {
        (*s3_p)[sVar5 & 0xffffffff] = psVar6[uVar12];
        break;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 <= uVar4);
  }
  if (uVar4 != 0) {
    uVar11 = 2;
    if (2 < uVar4 + 1) {
      uVar11 = (ulong)(uVar4 + 1);
    }
    lVar13 = 0;
    uVar12 = 0;
    do {
      bVar2 = sequence[lVar13];
      psVar14 = psVar9;
      if (((1 < bVar2 - 0x2d) && (bVar2 != 0x5f)) && (bVar2 != 0x7e)) {
        uVar10 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        (*ss_p)[uVar10] = bVar2;
        psVar6 = *S_p;
        psVar9 = *s5_p;
        psVar14 = psVar6;
      }
      psVar9[lVar13 + 2] = psVar14[lVar13 + 1];
      (*as_p)[lVar13 + 1] = uVar12;
      lVar13 = lVar13 + 1;
    } while (uVar11 - 1 != lVar13);
    if (uVar4 != 0) {
      uVar11 = sVar5 & 0xffffffff;
      do {
        bVar2 = sequence[uVar11 - 1];
        if (((bVar2 - 0x2d < 2) || (bVar2 == 0x7e)) || (bVar2 == 0x5f)) {
          psVar9 = *s3_p;
          psVar14 = psVar9;
        }
        else {
          psVar9 = *s3_p;
          psVar14 = psVar6;
        }
        psVar9[uVar11 - 1] = psVar14[uVar11];
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_aln_encode(const char    *sequence,
                short         **S_p,
                short         **s5_p,
                short         **s3_p,
                char          **ss_p,
                unsigned int  **as_p,
                vrna_md_t     *md)
{
  unsigned int i, l, p;

  l = strlen(sequence);

  (*s5_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*s3_p) = (short *)vrna_alloc((l + 2) * sizeof(short));
  (*as_p) = (unsigned int *)vrna_alloc((l + 2) * sizeof(unsigned int));
  (*ss_p) = (char *)vrna_alloc((l + 2) * sizeof(char));

  /* make numerical encoding of sequence */
  (*S_p) = vrna_seq_encode_simple(sequence, md);

  (*s5_p)[0] = (*s5_p)[1] = 0;

  if (md->oldAliEn) {
    /* use alignment sequences in all energy evaluations */
    (*ss_p)[0] = sequence[0];
    for (i = 1; i < l; i++) {
      (*s5_p)[i]  = (*S_p)[i - 1];
      (*s3_p)[i]  = (*S_p)[i + 1];
      (*ss_p)[i]  = sequence[i];
      (*as_p)[i]  = i;
    }
    (*ss_p)[l]    = sequence[l];
    (*as_p)[l]    = l;
    (*s5_p)[l]    = (*S_p)[l - 1];
    (*s3_p)[l]    = 0;
    (*S_p)[l + 1] = (*S_p)[1];
    (*s5_p)[1]    = 0;
    if (md->circ) {
      (*s5_p)[1]      = (*S_p)[l];
      (*s3_p)[l]      = (*S_p)[1];
      (*ss_p)[l + 1]  = (*S_p)[1];
    }
  } else {
    if (md->circ) {
      for (i = l; i > 0; i--) {
        char c5;
        c5 = sequence[i - 1];
        if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.'))
          continue;

        (*s5_p)[1] = (*S_p)[i];
        break;
      }
      for (i = 1; i <= l; i++) {
        char c3;
        c3 = sequence[i - 1];
        if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
          continue;

        (*s3_p)[l] = (*S_p)[i];
        break;
      }
    } else {
      (*s5_p)[1] = (*s3_p)[l] = 0;
    }

    for (i = 1, p = 0; i <= l; i++) {
      char c5;
      c5 = sequence[i - 1];
      if ((c5 == '-') || (c5 == '_') || (c5 == '~') || (c5 == '.')) {
        (*s5_p)[i + 1] = (*s5_p)[i];
      } else {
        /* no gap */
        (*ss_p)[p++]    = sequence[i - 1]; /*start at 0!!*/
        (*s5_p)[i + 1]  = (*S_p)[i];
      }

      (*as_p)[i] = p;
    }
    for (i = l; i >= 1; i--) {
      char c3;
      c3 = sequence[i - 1];
      if ((c3 == '-') || (c3 == '_') || (c3 == '~') || (c3 == '.'))
        (*s3_p)[i - 1] = (*s3_p)[i];
      else
        (*s3_p)[i - 1] = (*S_p)[i];
    }
  }
}